

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

void leb__SplittingMatrix(float (*splittingMatrix) [3],uint32_t splitBit)

{
  undefined8 in_RAX;
  undefined8 *puVar1;
  float *pfVar2;
  int j_1;
  undefined1 *puVar3;
  int i;
  long lVar4;
  undefined8 *puVar5;
  int j;
  long lVar6;
  int i_1;
  int i_2;
  long lVar7;
  float dp;
  float fVar8;
  float local_88;
  float local_84;
  lebMatrix3x3 splitMatrix;
  undefined1 local_58 [8];
  lebMatrix3x3 tra;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float local_8;
  undefined4 uStack_4;
  
  local_84 = (float)(int)splitBit;
  local_88 = 1.0 - local_84;
  splitMatrix[0][0] = 0.0;
  splitMatrix[0][1] = 0.5;
  splitMatrix[0][2] = 0.0;
  splitMatrix[1][0] = 0.5;
  splitMatrix[1][1] = 0.0;
  splitMatrix[1][2] = 1.0 - local_84;
  splitMatrix[2][0] = local_84;
  puVar1 = &local_28;
  _local_8 = CONCAT44((int)((ulong)in_RAX >> 0x20),splittingMatrix[2][2]);
  local_18 = *(undefined8 *)(splittingMatrix[1] + 1);
  uStack_10 = *(undefined8 *)splittingMatrix[2];
  local_28 = *(undefined8 *)*splittingMatrix;
  uStack_20 = *(undefined8 *)(*splittingMatrix + 2);
  puVar3 = local_58;
  lVar4 = 0;
  do {
    lVar6 = 0;
    puVar5 = puVar1;
    do {
      *(undefined4 *)(puVar3 + lVar6 * 4) = *(undefined4 *)puVar5;
      lVar6 = lVar6 + 1;
      puVar5 = (undefined8 *)((long)puVar5 + 0xc);
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 0xc;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
  } while (lVar4 != 3);
  pfVar2 = &local_88;
  lVar4 = 0;
  do {
    lVar6 = 0;
    puVar3 = local_58;
    do {
      fVar8 = 0.0;
      lVar7 = 0;
      do {
        fVar8 = fVar8 + pfVar2[lVar7] * *(float *)(puVar3 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      splittingMatrix[lVar4][lVar6] = fVar8;
      lVar6 = lVar6 + 1;
      puVar3 = puVar3 + 0xc;
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 3;
  } while (lVar4 != 3);
  return;
}

Assistant:

static void
leb__SplittingMatrix(lebMatrix3x3 splittingMatrix, uint32_t splitBit)
{
    float b = float(splitBit);
    float c = 1.0f - b;
    lebMatrix3x3 splitMatrix = {
        {c   , b   , 0.0f},
        {0.5f, 0.0f, 0.5f},
        {0.0f,    c,    b}
    };
    lebMatrix3x3 tmp;

    memcpy(tmp, splittingMatrix, sizeof(tmp));
    leb__Matrix3x3Product(splitMatrix, tmp, splittingMatrix);
}